

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::
ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::ObjHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter> *this)

{
  int index;
  int num_terms;
  LinearObjHandler LVar1;
  LinearPartHandler linear_expr;
  ObjHandler lh;
  
  lh.
  super_ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ItemType)1>
  .reader_ = (ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ItemType)1>
              )(ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ItemType)1>
                )this;
  index = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ReadUInt
                    ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)this,
                     *(uint *)(*(long *)(this + 8) + 8));
  num_terms = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ReadUInt
                        ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)this,1,
                         **(int **)(this + 8) + 1);
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  LVar1 = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ObjHandler::OnLinearExpr
                    (&lh,index,num_terms);
  linear_expr._8_8_ = LVar1._8_8_ & 0xffffffffff;
  linear_expr.num_terms = (int)LVar1._0_8_;
  linear_expr.nonlinear_expr_id = (int)((ulong)LVar1._0_8_ >> 0x20);
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::
  ReadLinearExpr<ExprPrinter::LinearPartHandler>
            ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)this,num_terms,
             linear_expr);
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}